

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O2

int cvLsBandDQJac(realtype t,N_Vector y,N_Vector fy,SUNMatrix Jac,CVodeMem cv_mem,N_Vector tmp1,
                 N_Vector tmp2)

{
  long *plVar1;
  double dVar2;
  void *pvVar3;
  uint uVar4;
  uint uVar5;
  sunindextype sVar6;
  sunindextype sVar7;
  uint uVar8;
  int iVar9;
  realtype *prVar10;
  realtype *prVar11;
  realtype *prVar12;
  realtype *prVar13;
  realtype *prVar14;
  long lVar15;
  ulong uVar16;
  realtype *prVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  realtype rVar24;
  double dVar25;
  double dVar26;
  double local_c8;
  double local_c0;
  realtype *local_b0;
  
  pvVar3 = cv_mem->cv_lmem;
  uVar5 = SUNBandMatrix_Columns(Jac);
  sVar6 = SUNBandMatrix_UpperBandwidth(Jac);
  sVar7 = SUNBandMatrix_LowerBandwidth(Jac);
  prVar10 = N_VGetArrayPointer(cv_mem->cv_ewt);
  prVar11 = N_VGetArrayPointer(fy);
  prVar12 = N_VGetArrayPointer(tmp1);
  prVar13 = N_VGetArrayPointer(y);
  prVar14 = N_VGetArrayPointer(tmp2);
  if (cv_mem->cv_constraintsSet == 0) {
    local_b0 = (realtype *)0x0;
  }
  else {
    local_b0 = N_VGetArrayPointer(cv_mem->cv_constraints);
  }
  N_VScale(1.0,y,tmp2);
  dVar25 = cv_mem->cv_uround;
  local_c0 = 0.0;
  if (0.0 < dVar25) {
    if (dVar25 < 0.0) {
      local_c0 = sqrt(dVar25);
    }
    else {
      local_c0 = SQRT(dVar25);
    }
  }
  rVar24 = N_VWrmsNorm(fy,cv_mem->cv_ewt);
  local_c8 = 1.0;
  if ((rVar24 != 0.0) || (NAN(rVar24))) {
    local_c8 = rVar24 * (double)(int)uVar5 * ABS(cv_mem->cv_h) * 1000.0 * cv_mem->cv_uround;
  }
  uVar8 = sVar7 + sVar6 + 1;
  uVar4 = uVar5;
  if ((int)uVar8 < (int)uVar5) {
    uVar4 = uVar8;
  }
  uVar21 = -sVar6;
  uVar19 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar19 = 0;
  }
  lVar15 = (long)(int)uVar8;
  lVar23 = 0;
  uVar18 = 0;
  do {
    uVar16 = uVar18;
    if (uVar18 == uVar19) {
      return 0;
    }
    for (; (long)uVar16 < (long)(int)uVar5; uVar16 = uVar16 + lVar15) {
      dVar25 = ABS(prVar13[uVar16]) * local_c0;
      if (ABS(prVar13[uVar16]) * local_c0 <= local_c8 / prVar10[uVar16]) {
        dVar25 = local_c8 / prVar10[uVar16];
      }
      if (cv_mem->cv_constraintsSet != 0) {
        dVar2 = local_b0[uVar16];
        dVar26 = ABS(dVar2);
        if ((dVar26 != 1.0) || (NAN(dVar26))) {
          if ((dVar26 == 2.0) && ((!NAN(dVar26) && (dVar2 * (prVar14[uVar16] + dVar25) <= 0.0))))
          goto LAB_003df3ba;
        }
        else if (dVar2 * (prVar14[uVar16] + dVar25) < 0.0) {
LAB_003df3ba:
          dVar25 = -dVar25;
        }
      }
      prVar14[uVar16] = dVar25 + prVar14[uVar16];
    }
    iVar9 = (*cv_mem->cv_f)(cv_mem->cv_tn,tmp2,tmp1,cv_mem->cv_user_data);
    plVar1 = (long *)((long)pvVar3 + 0x90);
    *plVar1 = *plVar1 + 1;
    lVar20 = lVar23;
    uVar16 = uVar18;
    uVar4 = uVar21;
    if (iVar9 != 0) {
      return iVar9;
    }
    while( true ) {
      uVar22 = 0;
      if (0 < (int)uVar4) {
        uVar22 = (ulong)uVar4;
      }
      if ((long)(int)uVar5 <= (long)uVar16) break;
      prVar14[uVar16] = prVar13[uVar16];
      prVar17 = SUNBandMatrix_Column(Jac,(int)uVar16);
      dVar25 = ABS(prVar13[uVar16]) * local_c0;
      if (ABS(prVar13[uVar16]) * local_c0 <= local_c8 / prVar10[uVar16]) {
        dVar25 = local_c8 / prVar10[uVar16];
      }
      if (cv_mem->cv_constraintsSet != 0) {
        dVar2 = local_b0[uVar16];
        dVar26 = ABS(dVar2);
        if ((dVar26 != 1.0) || (NAN(dVar26))) {
          if ((dVar26 == 2.0) && ((!NAN(dVar26) && (dVar2 * (prVar14[uVar16] + dVar25) <= 0.0))))
          goto LAB_003df530;
        }
        else if (dVar2 * (prVar14[uVar16] + dVar25) < 0.0) {
LAB_003df530:
          dVar25 = -dVar25;
        }
      }
      iVar9 = sVar7 + (int)uVar16;
      if ((int)(uVar5 - 1) <= iVar9) {
        iVar9 = uVar5 - 1;
      }
      for (; (long)uVar22 <= (long)iVar9; uVar22 = uVar22 + 1) {
        *(double *)((long)prVar17 + uVar22 * 8 + lVar20) =
             (prVar12[uVar22] - prVar11[uVar22]) * (1.0 / dVar25);
      }
      lVar20 = lVar20 + lVar15 * -8;
      uVar16 = uVar16 + lVar15;
      uVar4 = uVar4 + uVar8;
    }
    uVar18 = uVar18 + 1;
    uVar21 = uVar21 + 1;
    lVar23 = lVar23 + -8;
  } while( true );
}

Assistant:

int cvLsBandDQJac(realtype t, N_Vector y, N_Vector fy, SUNMatrix Jac,
                  CVodeMem cv_mem, N_Vector tmp1, N_Vector tmp2)
{
  N_Vector ftemp, ytemp;
  realtype fnorm, minInc, inc, inc_inv, srur, conj;
  realtype *col_j, *ewt_data, *fy_data, *ftemp_data;
  realtype *y_data, *ytemp_data, *cns_data;
  sunindextype group, i, j, width, ngroups, i1, i2;
  sunindextype N, mupper, mlower;
  CVLsMem cvls_mem;
  int retval = 0;

  /* initialize cns_data to avoid compiler warning */
  cns_data = NULL;

  /* access LsMem interface structure */
  cvls_mem = (CVLsMem) cv_mem->cv_lmem;

  /* access matrix dimensions */
  N = SUNBandMatrix_Columns(Jac);
  mupper = SUNBandMatrix_UpperBandwidth(Jac);
  mlower = SUNBandMatrix_LowerBandwidth(Jac);

  /* Rename work vectors for use as temporary values of y and f */
  ftemp = tmp1;
  ytemp = tmp2;

  /* Obtain pointers to the data for ewt, fy, ftemp, y, ytemp */
  ewt_data   = N_VGetArrayPointer(cv_mem->cv_ewt);
  fy_data    = N_VGetArrayPointer(fy);
  ftemp_data = N_VGetArrayPointer(ftemp);
  y_data     = N_VGetArrayPointer(y);
  ytemp_data = N_VGetArrayPointer(ytemp);
  if (cv_mem->cv_constraintsSet)
    cns_data = N_VGetArrayPointer(cv_mem->cv_constraints);

  /* Load ytemp with y = predicted y vector */
  N_VScale(ONE, y, ytemp);

  /* Set minimum increment based on uround and norm of f */
  srur = SUNRsqrt(cv_mem->cv_uround);
  fnorm = N_VWrmsNorm(fy, cv_mem->cv_ewt);
  minInc = (fnorm != ZERO) ?
    (MIN_INC_MULT * SUNRabs(cv_mem->cv_h) * cv_mem->cv_uround * N * fnorm) : ONE;

  /* Set bandwidth and number of column groups for band differencing */
  width = mlower + mupper + 1;
  ngroups = SUNMIN(width, N);

  /* Loop over column groups. */
  for (group=1; group <= ngroups; group++) {

    /* Increment all y_j in group */
    for(j=group-1; j < N; j+=width) {
      inc = SUNMAX(srur*SUNRabs(y_data[j]), minInc/ewt_data[j]);

      /* Adjust sign(inc) if yj has an inequality constraint. */
      if (cv_mem->cv_constraintsSet) {
        conj = cns_data[j];
        if (SUNRabs(conj) == ONE)      {if ((ytemp_data[j]+inc)*conj < ZERO)  inc = -inc;}
        else if (SUNRabs(conj) == TWO) {if ((ytemp_data[j]+inc)*conj <= ZERO) inc = -inc;}
      }

      ytemp_data[j] += inc;
    }

    /* Evaluate f with incremented y */
    retval = cv_mem->cv_f(cv_mem->cv_tn, ytemp, ftemp, cv_mem->cv_user_data);
    cvls_mem->nfeDQ++;
    if (retval != 0) break;

    /* Restore ytemp, then form and load difference quotients */
    for (j=group-1; j < N; j+=width) {
      ytemp_data[j] = y_data[j];
      col_j = SUNBandMatrix_Column(Jac, j);
      inc = SUNMAX(srur*SUNRabs(y_data[j]), minInc/ewt_data[j]);

      /* Adjust sign(inc) as before. */
      if (cv_mem->cv_constraintsSet) {
        conj = cns_data[j];
        if (SUNRabs(conj) == ONE)      {if ((ytemp_data[j]+inc)*conj < ZERO)  inc = -inc;}
        else if (SUNRabs(conj) == TWO) {if ((ytemp_data[j]+inc)*conj <= ZERO) inc = -inc;}
      }

      inc_inv = ONE/inc;
      i1 = SUNMAX(0, j-mupper);
      i2 = SUNMIN(j+mlower, N-1);
      for (i=i1; i <= i2; i++)
        SM_COLUMN_ELEMENT_B(col_j,i,j) = inc_inv * (ftemp_data[i] - fy_data[i]);
    }
  }

  return(retval);
}